

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O0

Comm adios2::helper::CommDummy(void)

{
  undefined8 *puVar1;
  _Head_base<0UL,_adios2::helper::CommImpl_*,_false> in_RDI;
  unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> comm;
  unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
  *in_stack_ffffffffffffffa8;
  unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
  *in_stack_ffffffffffffffd8;
  
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  CommImplDummy::CommImplDummy((CommImplDummy *)in_RDI._M_head_impl);
  std::unique_ptr<adios2::helper::CommImpl,std::default_delete<adios2::helper::CommImpl>>::
  unique_ptr<std::default_delete<adios2::helper::CommImpl>,void>
            ((unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> *
             )in_RDI._M_head_impl,(pointer)in_stack_ffffffffffffffa8);
  std::unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>::
  unique_ptr((unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> *
             )in_RDI._M_head_impl,in_stack_ffffffffffffffa8);
  CommImpl::MakeComm(in_stack_ffffffffffffffd8);
  std::unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>::
  ~unique_ptr((unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
               *)in_RDI._M_head_impl);
  std::unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>::
  ~unique_ptr((unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
               *)in_RDI._M_head_impl);
  return (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>)
         (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>)
         in_RDI._M_head_impl;
}

Assistant:

Comm CommDummy()
{
    auto comm = std::unique_ptr<CommImpl>(new CommImplDummy());
    return CommImpl::MakeComm(std::move(comm));
}